

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlC14NDocSave(xmlDocPtr doc,xmlNodeSetPtr nodes,int mode,xmlChar **inclusive_ns_prefixes,
                  int with_comments,char *filename,int compression)

{
  int iVar1;
  xmlOutputBufferPtr buf_00;
  int ret;
  xmlOutputBufferPtr buf;
  char *filename_local;
  int with_comments_local;
  xmlChar **inclusive_ns_prefixes_local;
  int mode_local;
  xmlNodeSetPtr nodes_local;
  xmlDocPtr doc_local;
  
  if (filename == (char *)0x0) {
    xmlC14NErrParam((xmlC14NCtxPtr)0x0);
    doc_local._4_4_ = -1;
  }
  else {
    buf_00 = xmlOutputBufferCreateFilename(filename,(xmlCharEncodingHandlerPtr)0x0,compression);
    if (buf_00 == (xmlOutputBufferPtr)0x0) {
      xmlC14NErr((xmlC14NCtxPtr)0x0,(xmlNodePtr)0x0,0x5dc,"creating temporary filename");
      doc_local._4_4_ = -1;
    }
    else {
      iVar1 = xmlC14NDocSaveTo(doc,nodes,mode,inclusive_ns_prefixes,with_comments,buf_00);
      if (iVar1 < 0) {
        xmlOutputBufferClose(buf_00);
        doc_local._4_4_ = -1;
      }
      else {
        doc_local._4_4_ = xmlOutputBufferClose(buf_00);
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlC14NDocSave(xmlDocPtr doc, xmlNodeSetPtr nodes,
               int mode, xmlChar ** inclusive_ns_prefixes,
               int with_comments, const char *filename, int compression)
{
    xmlOutputBufferPtr buf;
    int ret;

    if (filename == NULL) {
        xmlC14NErrParam(NULL);
        return (-1);
    }
#ifdef LIBXML_ZLIB_ENABLED
    if (compression < 0)
        compression = xmlGetCompressMode();
#endif

    /*
     * save the content to a temp buffer, use default UTF8 encoding.
     */
    buf = xmlOutputBufferCreateFilename(filename, NULL, compression);
    if (buf == NULL) {
        xmlC14NErr(NULL, NULL, XML_IO_UNKNOWN, "creating temporary filename");
        return (-1);
    }

    /*
     * canonize document and write to buffer
     */
    ret = xmlC14NDocSaveTo(doc, nodes, mode, inclusive_ns_prefixes,
                           with_comments, buf);
    if (ret < 0) {
        (void) xmlOutputBufferClose(buf);
        return (-1);
    }

    /*
     * get the numbers of bytes written
     */
    ret = xmlOutputBufferClose(buf);
    return (ret);
}